

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcommon.c
# Opt level: O0

void parse_arguments(arguments *args,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_24;
  int i;
  char **argv_local;
  int argc_local;
  arguments *args_local;
  
  memset(args,0,0x20);
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfffe | 1;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfffd | 2;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfffb | 4;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfff7 | 8;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xffef | 0x10;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xffdf | 0x20;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfbff;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xffbf;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xff7f;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfeff;
  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfdff;
  args->mainfunc = "setup";
  local_24 = 1;
  do {
    if (argc <= (int)local_24) {
      if ((args->filename != (char *)0x0) && (args->code == (char *)0x0)) {
        pcVar2 = read_file(args->filename);
        args->code = pcVar2;
      }
      return;
    }
    iVar1 = strcmp(argv[(int)local_24],"--notypecheck");
    if (iVar1 == 0) {
      *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfffe;
    }
    else {
      iVar1 = strcmp(argv[(int)local_24],"--nolinearize");
      if (iVar1 == 0) {
        *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfffd;
      }
      else {
        iVar1 = strcmp(argv[(int)local_24],"--noastdump");
        if (iVar1 == 0) {
          *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfffb;
        }
        else {
          iVar1 = strcmp(argv[(int)local_24],"--noirdump");
          if (iVar1 == 0) {
            *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfff7;
          }
          else {
            iVar1 = strcmp(argv[(int)local_24],"--nocodump");
            if (iVar1 == 0) {
              *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xffdf;
            }
            else {
              iVar1 = strcmp(argv[(int)local_24],"--nocfgdump");
              if (iVar1 == 0) {
                *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xffef;
              }
              else {
                iVar1 = strcmp(argv[(int)local_24],"--simplify-ast");
                if (iVar1 == 0) {
                  *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xffbf | 0x40;
                }
                else {
                  iVar1 = strcmp(argv[(int)local_24],"--remove-unreachable-blocks");
                  if (iVar1 == 0) {
                    *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xff7f | 0x80;
                  }
                  else {
                    iVar1 = strcmp(argv[(int)local_24],"--gen-C");
                    if (iVar1 == 0) {
                      *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfeff | 0x100;
                    }
                    else {
                      iVar1 = strcmp(argv[(int)local_24],"--opt-upvalues");
                      if (iVar1 == 0) {
                        *(ushort *)&args->field_0x10 = *(ushort *)&args->field_0x10 & 0xfdff | 0x200
                        ;
                      }
                      else {
                        iVar1 = strcmp(argv[(int)local_24],"--table-ast");
                        if (iVar1 == 0) {
                          *(ushort *)&args->field_0x10 =
                               *(ushort *)&args->field_0x10 & 0xfbff | 0x400;
                        }
                        else {
                          iVar1 = strcmp(argv[(int)local_24],"-main");
                          if (iVar1 == 0) {
                            if (argc + -1 <= (int)local_24) {
                              fprintf(_stderr,"Missing argument after -main\n");
                              exit(1);
                            }
                            local_24 = local_24 + 1;
                            pcVar2 = strdup(argv[(int)local_24]);
                            args->mainfunc = pcVar2;
                          }
                          else {
                            iVar1 = strcmp(argv[(int)local_24],"-f");
                            if (iVar1 == 0) {
                              if (args->filename == (char *)0x0) {
                                if (argc + -1 <= (int)local_24) {
                                  fprintf(_stderr,"Missing file name after -f\n");
                                  exit(1);
                                }
                                local_24 = local_24 + 1;
                                pcVar2 = strdup(argv[(int)local_24]);
                                args->filename = pcVar2;
                              }
                              else {
                                fprintf(_stderr,"-f already accepted\n");
                              }
                            }
                            else {
                              if (args->code != (char *)0x0) {
                                fprintf(_stderr,"Bad argument at %d",(ulong)local_24);
                                exit(1);
                              }
                              pcVar2 = strdup(argv[(int)local_24]);
                              args->code = pcVar2;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

void parse_arguments(struct arguments *args, int argc, const char *argv[])
{
	memset(args, 0, sizeof *args);
	args->typecheck = 1;
	args->linearize = 1;
	args->astdump = 1;
	args->irdump = 1;
	args->cfgdump = 1;
	args->codump = 1;
	args->table_ast = 0;
	args->simplify_ast = 0;
	args->remove_unreachable_blocks = 0;
	args->gen_C = 0;
	args->opt_upvalue = 0;
	args->mainfunc = "setup";
	for (int i = 1; i < argc; i++) {
		if (strcmp(argv[i], "--notypecheck") == 0) {
			args->typecheck = 0;
		} else if (strcmp(argv[i], "--nolinearize") == 0) {
			args->linearize = 0;
		} else if (strcmp(argv[i], "--noastdump") == 0) {
			args->astdump = 0;
		} else if (strcmp(argv[i], "--noirdump") == 0) {
			args->irdump = 0;
		} else if (strcmp(argv[i], "--nocodump") == 0) {
			args->codump = 0;
		} else if (strcmp(argv[i], "--nocfgdump") == 0) {
			args->cfgdump = 0;
		} else if (strcmp(argv[i], "--simplify-ast") == 0) {
			args->simplify_ast = 1;
		} else if (strcmp(argv[i], "--remove-unreachable-blocks") == 0) {
			args->remove_unreachable_blocks = 1;
		} else if (strcmp(argv[i], "--gen-C") == 0) {
			args->gen_C = 1;
		} else if (strcmp(argv[i], "--opt-upvalues") == 0) {
			args->opt_upvalue = 1;
		} else if (strcmp(argv[i], "--table-ast") == 0) {
			args->table_ast = 1;
		} else if (strcmp(argv[i], "-main") == 0) {
			if (i < argc - 1) {
				i++;
				args->mainfunc = strdup(argv[i]);
			} else {
				fprintf(stderr, "Missing argument after -main\n");
				exit(1);
			}
		} else if (strcmp(argv[i], "-f") == 0) {
			if (args->filename) {
				fprintf(stderr, "-f already accepted\n");
				continue;
			}
			if (i < argc - 1) {
				i++;
				args->filename = strdup(argv[i]);
			} else {
				fprintf(stderr, "Missing file name after -f\n");
				exit(1);
			}
		} else {
			if (args->code) {
				fprintf(stderr, "Bad argument at %d", i);
				exit(1);
			} else {
				args->code = strdup(argv[i]);
			}
		}
	}
	if (args->filename && !args->code) {
		args->code = read_file(args->filename);
	}
}